

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,FloppyInterfaceMode interface_mode)

{
  char *__s;
  allocator<char> local_9;
  
  switch(interface_mode) {
  case IBMPC_DD_FLOPPYMODE:
    __s = "IBMPC_DD_FLOPPYMODE";
    break;
  case IBMPC_HD_FLOPPYMODE:
    __s = "IBMPC_HD_FLOPPYMODE";
    break;
  case ATARIST_DD_FLOPPYMODE:
    __s = "ATARIST_DD_FLOPPYMODE";
    break;
  case ATARIST_HD_FLOPPYMODE:
    __s = "ATARIST_HD_FLOPPYMODE";
    break;
  case AMIGA_DD_FLOPPYMODE:
    __s = "AMIGA_DD_FLOPPYMODE";
    break;
  case AMIGA_HD_FLOPPYMODE:
    __s = "AMIGA_HD_FLOPPYMODE";
    break;
  case CPC_DD_FLOPPYMODE:
    __s = "CPC_DD_FLOPPYMODE";
    break;
  case GENERIC_SHUGART_DD_FLOPPYMODE:
    __s = "GENERIC_SHUGART_DD_FLOPPYMODE";
    break;
  case IBMPC_ED_FLOPPYMODE:
    __s = "IBMPC_ED_FLOPPYMODE";
    break;
  case MSX2_DD_FLOPPYMODE:
    __s = "MSX2_DD_FLOPPYMODE";
    break;
  case C64_DD_FLOPPYMODE:
    __s = "C64_DD_FLOPPYMODE";
    break;
  case EMU_SHUGART_FLOPPYMODE:
    __s = "EMU_SHUGART_FLOPPYMODE";
    break;
  case S950_DD_FLOPPYMODE:
    __s = "S950_DD_FLOPPYMODE";
    break;
  case S950_HD_FLOPPYMODE:
    __s = "S950_HD_FLOPPYMODE";
    break;
  default:
    if (interface_mode == DISABLE_FLOPPYMODE) {
      __s = "DISABLE_FLOPPYMODE";
    }
    else {
      __s = "Unknown";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(FloppyInterfaceMode interface_mode)
{
    switch (interface_mode)
    {
    case IBMPC_DD_FLOPPYMODE:   return "IBMPC_DD_FLOPPYMODE";   break;
    case IBMPC_HD_FLOPPYMODE:   return "IBMPC_HD_FLOPPYMODE";   break;
    case ATARIST_DD_FLOPPYMODE: return "ATARIST_DD_FLOPPYMODE"; break;
    case ATARIST_HD_FLOPPYMODE: return "ATARIST_HD_FLOPPYMODE"; break;
    case AMIGA_DD_FLOPPYMODE:   return "AMIGA_DD_FLOPPYMODE";   break;
    case AMIGA_HD_FLOPPYMODE:   return "AMIGA_HD_FLOPPYMODE";   break;
    case CPC_DD_FLOPPYMODE:     return "CPC_DD_FLOPPYMODE";     break;
    case GENERIC_SHUGART_DD_FLOPPYMODE: return "GENERIC_SHUGART_DD_FLOPPYMODE"; break;
    case IBMPC_ED_FLOPPYMODE:   return "IBMPC_ED_FLOPPYMODE";   break;
    case MSX2_DD_FLOPPYMODE:    return "MSX2_DD_FLOPPYMODE";    break;
    case C64_DD_FLOPPYMODE:     return "C64_DD_FLOPPYMODE";     break;
    case EMU_SHUGART_FLOPPYMODE:return "EMU_SHUGART_FLOPPYMODE"; break;
    case S950_DD_FLOPPYMODE:    return "S950_DD_FLOPPYMODE";    break;
    case S950_HD_FLOPPYMODE:    return "S950_HD_FLOPPYMODE";    break;
    case DISABLE_FLOPPYMODE:    return "DISABLE_FLOPPYMODE";    break;
    }
    return "Unknown";
}